

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O2

void __thiscall
Ratio::setAllEEdges(Ratio *this,vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges)

{
  double dVar1;
  
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator=(&this->eEdges,edges);
  dVar1 = geoAvg(&this->eEdges);
  this->eLength = dVar1;
  return;
}

Assistant:

void Ratio::setAllEEdges(vector<PhyloTreeEdge>& edges) {
    eEdges = edges;
    eLength = geoAvg(eEdges);
}